

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spm.cpp
# Opt level: O3

int __thiscall pg::SPMSolver::pm_cycles(SPMSolver *this,int *a,int pl)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = (uint)this->k;
  uVar2 = ~(uint)((ulong)(uVar2 & 1) == (long)pl) + uVar2;
  if (-1 < (int)uVar2) {
    do {
      if (this->counts[uVar2] < a[uVar2]) {
        return uVar2;
      }
      bVar1 = 1 < (int)uVar2;
      uVar2 = uVar2 - 2;
    } while (bVar1);
  }
  return -1;
}

Assistant:

int
SPMSolver::pm_cycles(int *a, int pl)
{
    int m = k-1;
    if ((k&1)==pl) m--;
    for (int i=m; i>=0; i-=2) {
        if (a[i] > counts[i]) return i;
    }
    return -1;
}